

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O0

void Mix(short *pFinalOut,uint Frames)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  CVoice *pCVar6;
  ulong uVar7;
  int *piVar8;
  uint in_ESI;
  long in_RDI;
  float fVar9;
  float fVar10;
  double dVar11;
  double dVar12;
  int vr;
  int vl;
  int j;
  uint i_1;
  uint s;
  float RampFactor;
  float LampFactor;
  float Rpan;
  float Lpan;
  float FalloffAmp;
  float Falloff;
  float Dist;
  int dy;
  int dx;
  int Lvol;
  int Rvol;
  uint End;
  short *pInR;
  short *pInL;
  int Step;
  int *pOut;
  CVoice *v;
  uint i;
  int MasterVol;
  uint in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint local_78;
  uint local_74;
  int local_4c;
  int local_48;
  uint local_44;
  short *local_40;
  short *local_38;
  int *local_28;
  uint local_14;
  
  mem_zero((void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
           in_stack_ffffffffffffff7c);
  uVar2 = minimum<unsigned_int>(in_ESI,m_MaxFrames);
  lock_wait((LOCK)0x13efce);
  for (local_14 = 0; local_14 < 0x40; local_14 = local_14 + 1) {
    if (m_aVoices[local_14].m_pSample != (CSample *)0x0) {
      uVar7 = (ulong)local_14;
      pCVar6 = m_aVoices + uVar7;
      local_28 = m_pMixBuffer;
      iVar5 = pCVar6->m_pSample->m_Channels;
      local_38 = pCVar6->m_pSample->m_pData + m_aVoices[uVar7].m_Tick * iVar5;
      local_44 = pCVar6->m_pSample->m_NumFrames - m_aVoices[uVar7].m_Tick;
      local_48 = (m_aVoices[uVar7].m_pChannel)->m_Vol;
      local_4c = (m_aVoices[uVar7].m_pChannel)->m_Vol;
      if (uVar2 < local_44) {
        local_44 = uVar2;
      }
      local_40 = pCVar6->m_pSample->m_pData + (m_aVoices[uVar7].m_Tick * iVar5 + 1);
      if (pCVar6->m_pSample->m_Channels == 1) {
        local_40 = local_38;
      }
      if ((m_aVoices[uVar7].m_Flags & 2U) != 0) {
        iVar3 = m_aVoices[uVar7].m_X - m_CenterX;
        iVar4 = m_aVoices[uVar7].m_Y - m_CenterY;
        fVar9 = sqrtf((float)iVar3 * (float)iVar3 + (float)(iVar4 * iVar4));
        if ((fVar9 < 0.0) || (m_MaxDistance <= fVar9)) {
          local_4c = 0;
          local_48 = 0;
        }
        else {
          fVar9 = (float)(m_aVoices[uVar7].m_pChannel)->m_Vol * (1.0 - fVar9 / m_MaxDistance);
          fVar10 = 0.5 - ((float)iVar3 / m_MaxDistance) / 2.0;
          dVar11 = std::sqrt((double)(ulong)(uint)fVar10);
          dVar12 = std::sqrt((double)(ulong)(uint)(1.0 - fVar10));
          local_4c = (int)(fVar9 * SUB84(dVar11,0));
          local_48 = (int)(fVar9 * SUB84(dVar12,0));
        }
      }
      for (local_74 = 0; local_74 < local_44; local_74 = local_74 + 1) {
        piVar8 = local_28 + 1;
        *local_28 = *local_38 * local_4c + *local_28;
        local_28 = local_28 + 2;
        *piVar8 = *local_40 * local_48 + *piVar8;
        local_38 = local_38 + iVar5;
        local_40 = local_40 + iVar5;
        m_aVoices[uVar7].m_Tick = m_aVoices[uVar7].m_Tick + 1;
      }
      if (m_aVoices[uVar7].m_Tick == pCVar6->m_pSample->m_NumFrames) {
        if ((m_aVoices[uVar7].m_Flags & 1U) == 0) {
          pCVar6->m_pSample = (CSample *)0x0;
        }
        else {
          m_aVoices[uVar7].m_Tick = 0;
        }
      }
    }
  }
  lock_unlock((LOCK)0x13f356);
  for (local_78 = 0; local_78 < uVar2; local_78 = local_78 + 1) {
    iVar5 = local_78 * 2;
    sVar1 = Int2Short(0);
    *(short *)(in_RDI + (long)iVar5 * 2) = sVar1;
    sVar1 = Int2Short(0);
    *(short *)(in_RDI + (long)(iVar5 + 1) * 2) = sVar1;
  }
  return;
}

Assistant:

static void Mix(short *pFinalOut, unsigned Frames)
{
	int MasterVol;
	mem_zero(m_pMixBuffer, m_MaxFrames*2*sizeof(int));
	Frames = minimum(Frames, m_MaxFrames);

	// aquire lock while we are mixing
	lock_wait(m_SoundLock);

	MasterVol = m_SoundVolume;

	for(unsigned i = 0; i < NUM_VOICES; i++)
	{
		if(m_aVoices[i].m_pSample)
		{
			// mix voice
			CVoice *v = &m_aVoices[i];
			int *pOut = m_pMixBuffer;

			int Step = v->m_pSample->m_Channels; // setup input sources
			short *pInL = &v->m_pSample->m_pData[v->m_Tick*Step];
			short *pInR = &v->m_pSample->m_pData[v->m_Tick*Step+1];

			unsigned End = v->m_pSample->m_NumFrames-v->m_Tick;

			int Rvol = v->m_pChannel->m_Vol;
			int Lvol = v->m_pChannel->m_Vol;

			// make sure that we don't go outside the sound data
			if(Frames < End)
				End = Frames;

			// check if we have a mono sound
			if(v->m_pSample->m_Channels == 1)
				pInR = pInL;

			// volume calculation
			if(v->m_Flags&ISound::FLAG_POS)
			{
				int dx = v->m_X - m_CenterX;
				int dy = v->m_Y - m_CenterY;
				float Dist = sqrtf((float)dx*dx+dy*dy);
				if(Dist >= 0.0f && Dist < m_MaxDistance)
				{
					// linear falloff
					float Falloff = 1.0f - Dist/m_MaxDistance;

					// amplitude after falloff
					float FalloffAmp = v->m_pChannel->m_Vol * Falloff;

					// distribute volume to the channels depending on x difference
					float Lpan = 0.5f - dx/m_MaxDistance/2.0f;
					float Rpan = 1.0f - Lpan;

					// apply square root to preserve sound power after panning
					float LampFactor = sqrt(Lpan);
					float RampFactor = sqrt(Rpan);

					// volume of the channels
					Lvol = FalloffAmp*LampFactor;
					Rvol = FalloffAmp*RampFactor;
				}
				else
				{
					Lvol = 0;
					Rvol = 0;
				}
			}

			// process all frames
			for(unsigned s = 0; s < End; s++)
			{
				*pOut++ += (*pInL)*Lvol;
				*pOut++ += (*pInR)*Rvol;
				pInL += Step;
				pInR += Step;
				v->m_Tick++;
			}

			// free voice if not used any more
			if(v->m_Tick == v->m_pSample->m_NumFrames)
			{
				if(v->m_Flags&ISound::FLAG_LOOP)
					v->m_Tick = 0;
				else
					v->m_pSample = 0;
			}
		}
	}


	// release the lock
	lock_unlock(m_SoundLock);

	// clamp accumulated values
	// TODO: this seams slow
	for(unsigned i = 0; i < Frames; ++i)
	{
		int j = i<<1;
		int vl = ((m_pMixBuffer[j]*MasterVol)/101)>>8;
		int vr = ((m_pMixBuffer[j+1]*MasterVol)/101)>>8;

		pFinalOut[j] = Int2Short(vl);
		pFinalOut[j+1] = Int2Short(vr);
	}

#if defined(CONF_ARCH_ENDIAN_BIG)
	swap_endian(pFinalOut, sizeof(short), Frames * 2);
#endif
}